

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muhash.cpp
# Opt level: O1

void __thiscall Num3072::Square(Num3072 *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  int i_1;
  ulong uVar14;
  ulong uVar15;
  int i;
  ulong uVar16;
  ulong uVar17;
  int j;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  limb_t *plVar25;
  uint uVar26;
  limb_t *plVar27;
  long lVar28;
  ulong uVar29;
  limb_t *plVar30;
  long in_FS_OFFSET;
  bool bVar31;
  bool bVar32;
  Num3072 tmp;
  ulong local_1b8;
  undefined1 local_1b0 [368];
  ulong local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_1b8 = 1;
  memset(local_1b0,0,0x178);
  plVar25 = this->limbs;
  uVar16 = 0;
  local_40 = 0;
  plVar30 = this->limbs;
  uVar15 = 0;
  do {
    plVar25 = plVar25 + 1;
    uVar26 = 0x2fU - (int)uVar15 >> 1;
    if (uVar15 < 0x2e) {
      uVar17 = 0;
      lVar21 = 0;
      uVar24 = 0;
      uVar22 = 0;
      plVar27 = this->limbs + 0x2f;
      do {
        auVar1._8_8_ = 0;
        auVar1._0_8_ = *plVar27;
        auVar9._8_8_ = 0;
        auVar9._0_8_ = plVar25[uVar17];
        uVar23 = SUB168(auVar1 * auVar9,8);
        uVar14 = SUB168(auVar1 * auVar9,0);
        bVar31 = CARRY8(uVar22,uVar14);
        uVar19 = uVar22 + uVar14;
        bVar32 = CARRY8(uVar24,uVar23);
        uVar18 = uVar24 + uVar23;
        uVar20 = uVar18 + bVar31;
        uVar22 = uVar19 + uVar14;
        uVar14 = (ulong)CARRY8(uVar19,uVar14);
        uVar19 = uVar20 + uVar23;
        uVar24 = uVar19 + uVar14;
        lVar21 = lVar21 + (ulong)(bVar32 || CARRY8(uVar18,(ulong)bVar31)) +
                 (ulong)(CARRY8(uVar20,uVar23) || CARRY8(uVar19,uVar14));
        uVar17 = uVar17 + 1;
        plVar27 = plVar27 + -1;
      } while (uVar17 < uVar26);
    }
    else {
      uVar22 = 0;
      uVar24 = 0;
      lVar21 = 0;
    }
    uVar17 = uVar15 + 1;
    if ((uVar15 & 1) == 0) {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = this->limbs[0x2f - uVar26];
      auVar10._8_8_ = 0;
      auVar10._0_8_ = this->limbs[uVar26 + (int)uVar17];
      uVar18 = SUB168(auVar2 * auVar10,8);
      uVar14 = SUB168(auVar2 * auVar10,0);
      bVar31 = CARRY8(uVar22,uVar14);
      uVar22 = uVar22 + uVar14;
      uVar14 = (ulong)bVar31;
      bVar31 = CARRY8(uVar24,uVar18);
      uVar18 = uVar24 + uVar18;
      uVar24 = uVar18 + uVar14;
      lVar21 = lVar21 + (ulong)(bVar31 || CARRY8(uVar18,uVar14));
    }
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar22;
    uVar19 = SUB168(auVar3 * ZEXT816(0x10d765),8);
    uVar22 = SUB168(auVar3 * ZEXT816(0x10d765),0);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar24;
    uVar14 = SUB168(auVar4 * ZEXT816(0x10d765),0);
    uVar18 = uVar14 + uVar16;
    uVar23 = uVar22 + local_40;
    uVar22 = (ulong)CARRY8(uVar22,local_40);
    uVar24 = uVar18 + uVar19;
    local_40 = uVar24 + uVar22;
    uVar16 = lVar21 * 0x10d765 + SUB168(auVar4 * ZEXT816(0x10d765),8) + (ulong)CARRY8(uVar14,uVar16)
             + (ulong)(CARRY8(uVar18,uVar19) || CARRY8(uVar24,uVar22));
    uVar22 = uVar17 >> 1 & 0x7fffffff;
    if (uVar15 != 0) {
      uVar24 = 0;
      plVar27 = plVar30;
      do {
        auVar5._8_8_ = 0;
        auVar5._0_8_ = *plVar27;
        auVar11._8_8_ = 0;
        auVar11._0_8_ = this->limbs[uVar24];
        uVar20 = SUB168(auVar5 * auVar11,8);
        uVar14 = SUB168(auVar5 * auVar11,0);
        bVar31 = CARRY8(uVar23,uVar14);
        uVar19 = uVar23 + uVar14;
        bVar32 = CARRY8(local_40,uVar20);
        uVar18 = local_40 + uVar20;
        uVar29 = uVar18 + bVar31;
        uVar23 = uVar19 + uVar14;
        uVar14 = (ulong)CARRY8(uVar19,uVar14);
        uVar19 = uVar29 + uVar20;
        local_40 = uVar19 + uVar14;
        uVar16 = uVar16 + (bVar32 || CARRY8(uVar18,(ulong)bVar31)) +
                 (ulong)(CARRY8(uVar29,uVar20) || CARRY8(uVar19,uVar14));
        uVar24 = uVar24 + 1;
        plVar27 = plVar27 + -1;
      } while (uVar24 < uVar22);
    }
    if ((uVar15 & 1) == 0) {
      auVar6._8_8_ = 0;
      auVar6._0_8_ = *(ulong *)((long)this + (uVar15 - uVar22) * 8);
      auVar12._8_8_ = 0;
      auVar12._0_8_ = this->limbs[uVar22];
      uVar24 = SUB168(auVar6 * auVar12,8);
      uVar22 = SUB168(auVar6 * auVar12,0);
      bVar31 = CARRY8(uVar23,uVar22);
      uVar23 = uVar23 + uVar22;
      uVar22 = (ulong)bVar31;
      bVar31 = CARRY8(local_40,uVar24);
      uVar24 = local_40 + uVar24;
      local_40 = uVar24 + uVar22;
      uVar16 = uVar16 + (bVar31 || CARRY8(uVar24,uVar22));
    }
    *(ulong *)(local_1b0 + uVar15 * 8 + -8) = uVar23;
    plVar30 = plVar30 + 1;
    uVar15 = uVar17;
  } while (uVar17 != 0x2f);
  plVar25 = this->limbs + 0x2f;
  lVar28 = 0;
  lVar21 = 0;
  do {
    auVar7._8_8_ = 0;
    auVar7._0_8_ = *plVar25;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = this->limbs[lVar28];
    uVar14 = SUB168(auVar7 * auVar13,8);
    uVar15 = SUB168(auVar7 * auVar13,0);
    bVar31 = CARRY8(local_40,uVar15);
    uVar24 = local_40 + uVar15;
    bVar32 = CARRY8(uVar16,uVar14);
    uVar22 = uVar16 + uVar14;
    uVar17 = uVar22 + bVar31;
    local_40 = uVar24 + uVar15;
    uVar15 = (ulong)CARRY8(uVar24,uVar15);
    uVar24 = uVar17 + uVar14;
    uVar16 = uVar24 + uVar15;
    lVar21 = lVar21 + (ulong)(bVar32 || CARRY8(uVar22,(ulong)bVar31)) +
             (ulong)(CARRY8(uVar17,uVar14) || CARRY8(uVar24,uVar15));
    lVar28 = lVar28 + 1;
    plVar25 = plVar25 + -1;
  } while (lVar28 != 0x18);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar16;
  uVar16 = SUB168(auVar8 * ZEXT816(0x10d765),0);
  uVar15 = lVar21 * 0x10d765 + SUB168(auVar8 * ZEXT816(0x10d765),8);
  lVar21 = 0;
  do {
    bVar31 = CARRY8(uVar16,*(ulong *)(local_1b0 + lVar21 * 8 + -8));
    this->limbs[lVar21] = uVar16 + *(ulong *)(local_1b0 + lVar21 * 8 + -8);
    uVar16 = uVar15 + 1;
    if (!bVar31) {
      uVar16 = uVar15;
    }
    bVar31 = bVar31 && uVar15 + 1 == 0;
    uVar15 = (ulong)bVar31;
    lVar21 = lVar21 + 1;
  } while (lVar21 != 0x30);
  if (bVar31) {
    __assert_fail("c1 == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/crypto/muhash.cpp"
                  ,0xf4,"void Num3072::Square()");
  }
  if (1 < uVar16) {
    __assert_fail("c0 == 0 || c0 == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/crypto/muhash.cpp"
                  ,0xf5,"void Num3072::Square()");
  }
  if ((0xffffffffffef289a < this->limbs[0]) && (this->limbs[1] == 0xffffffffffffffff)) {
    lVar21 = 2;
    do {
      lVar28 = lVar21;
      if (lVar28 == 0x30) break;
      lVar21 = lVar28 + 1;
    } while (this->limbs[lVar28] == 0xffffffffffffffff);
    if (0x2e < lVar28 - 1U) {
      uVar15 = 0x10d765;
      lVar21 = 0;
      do {
        plVar25 = this->limbs + lVar21;
        uVar22 = *plVar25;
        *plVar25 = *plVar25 + uVar15;
        uVar15 = (ulong)CARRY8(uVar22,uVar15);
        lVar21 = lVar21 + 1;
      } while (lVar21 != 0x30);
    }
  }
  if (uVar16 != 0) {
    uVar15 = 0x10d765;
    lVar21 = 0;
    do {
      plVar25 = this->limbs + lVar21;
      uVar16 = *plVar25;
      *plVar25 = *plVar25 + uVar15;
      uVar15 = (ulong)CARRY8(uVar16,uVar15);
      lVar21 = lVar21 + 1;
    } while (lVar21 != 0x30);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Num3072::Square()
{
    limb_t c0 = 0, c1 = 0, c2 = 0;
    Num3072 tmp;

    /* Compute limbs 0..N-2 of this*this into tmp, including one reduction. */
    for (int j = 0; j < LIMBS - 1; ++j) {
        limb_t d0 = 0, d1 = 0, d2 = 0;
        for (int i = 0; i < (LIMBS - 1 - j) / 2; ++i) muldbladd3(d0, d1, d2, this->limbs[i + j + 1], this->limbs[LIMBS - 1 - i]);
        if ((j + 1) & 1) muladd3(d0, d1, d2, this->limbs[(LIMBS - 1 - j) / 2 + j + 1], this->limbs[LIMBS - 1 - (LIMBS - 1 - j) / 2]);
        mulnadd3(c0, c1, c2, d0, d1, d2, MAX_PRIME_DIFF);
        for (int i = 0; i < (j + 1) / 2; ++i) muldbladd3(c0, c1, c2, this->limbs[i], this->limbs[j - i]);
        if ((j + 1) & 1) muladd3(c0, c1, c2, this->limbs[(j + 1) / 2], this->limbs[j - (j + 1) / 2]);
        extract3(c0, c1, c2, tmp.limbs[j]);
    }

    assert(c2 == 0);
    for (int i = 0; i < LIMBS / 2; ++i) muldbladd3(c0, c1, c2, this->limbs[i], this->limbs[LIMBS - 1 - i]);
    extract3(c0, c1, c2, tmp.limbs[LIMBS - 1]);

    /* Perform a second reduction. */
    muln2(c0, c1, MAX_PRIME_DIFF);
    for (int j = 0; j < LIMBS; ++j) {
        addnextract2(c0, c1, tmp.limbs[j], this->limbs[j]);
    }

    assert(c1 == 0);
    assert(c0 == 0 || c0 == 1);

    /* Perform up to two more reductions if the internal state has already
     * overflown the MAX of Num3072 or if it is larger than the modulus or
     * if both are the case.
     * */
    if (this->IsOverflow()) this->FullReduce();
    if (c0) this->FullReduce();
}